

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

VertexIter __thiscall CMU462::HalfedgeMesh::collapseEdge(HalfedgeMesh *this,EdgeIter e)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_iterator<CMU462::Face> *p_Var4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  _List_iterator<CMU462::Halfedge> _Var8;
  _List_iterator<CMU462::Halfedge> *hj;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_iterator<CMU462::Halfedge> *p_Var11;
  _List_node_base *p_Var12;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1;
  _List_iterator<CMU462::Face> _Var13;
  _List_iterator<CMU462::Edge> *ej;
  _List_node_base *p_Var14;
  _List_iterator<CMU462::Edge> *p_Var15;
  _List_iterator<CMU462::Halfedge> *hj_1;
  _List_iterator<CMU462::Halfedge> _Var16;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  HalfedgeIter h_twin;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  HalfedgeIter h_n_twin;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_delete_vec;
  FaceIter f_n_p1;
  value_type h_n;
  HalfedgeIter h_0_twin;
  FaceIter f_0;
  EdgeIter e_n;
  EdgeIter e_0;
  value_type h_0;
  HalfedgeIter hi;
  HalfedgeIter h;
  _List_iterator<CMU462::Halfedge> *local_168;
  iterator iStack_160;
  _List_iterator<CMU462::Halfedge> *local_158;
  _List_iterator<CMU462::Halfedge> local_150;
  _List_iterator<CMU462::Face> *local_148;
  iterator iStack_140;
  _List_iterator<CMU462::Face> *local_138;
  _List_iterator<CMU462::Edge> *local_128;
  iterator iStack_120;
  _List_iterator<CMU462::Edge> *local_118;
  _List_iterator<CMU462::Halfedge> local_110;
  _List_iterator<CMU462::Halfedge> *local_108;
  iterator iStack_100;
  _List_iterator<CMU462::Halfedge> *local_f8;
  _List_node_base *local_e8;
  _List_iterator<CMU462::Face> local_e0;
  _List_iterator<CMU462::Halfedge> local_d8;
  _List_iterator<CMU462::Halfedge> local_d0;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _List_iterator<CMU462::Face> local_b8;
  _List_iterator<CMU462::Edge> local_b0;
  _List_iterator<CMU462::Edge> local_a8;
  _List_iterator<CMU462::Halfedge> local_a0;
  _List_iterator<CMU462::Halfedge> local_98;
  _List_iterator<CMU462::Halfedge> local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _List_iterator<CMU462::Edge> local_68;
  _Rb_tree<std::_List_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::_Identity<std::_List_iterator<CMU462::Edge>_>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_60;
  
  local_68._M_node = e._M_node;
  remove_tetrahedron((set<std::_List_iterator<CMU462::Edge>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      *)&local_60,this,e);
  std::
  _Rb_tree<std::_List_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::_Identity<std::_List_iterator<CMU462::Edge>_>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~_Rb_tree(&local_60);
  local_90._M_node = e._M_node[5]._M_prev;
  local_150._M_node = local_90._M_node[1]._M_next;
  p_Var2 = local_90._M_node[2]._M_next;
  local_c0 = local_150._M_node[2]._M_next;
  local_168 = (_List_iterator<CMU462::Halfedge> *)0x0;
  iStack_160._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_158 = (_List_iterator<CMU462::Halfedge> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
  ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
            ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
              *)&local_168,(iterator)0x0,&local_90);
  if (iStack_160._M_current == local_158) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_168,iStack_160,&local_150);
  }
  else {
    (iStack_160._M_current)->_M_node = local_150._M_node;
    iStack_160._M_current = iStack_160._M_current + 1;
  }
  local_108 = (_List_iterator<CMU462::Halfedge> *)0x0;
  iStack_100._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_f8 = (_List_iterator<CMU462::Halfedge> *)0x0;
  p_Var9 = local_150._M_node[1]._M_next[1]._M_prev;
  do {
    local_98._M_node = p_Var9;
    if (iStack_100._M_current == local_f8) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_108,iStack_100,&local_98);
    }
    else {
      (iStack_100._M_current)->_M_node = p_Var9;
      iStack_100._M_current = iStack_100._M_current + 1;
    }
    p_Var9 = local_98._M_node[1]._M_next[1]._M_prev;
  } while (p_Var9 != local_150._M_node);
  local_a0._M_node = local_108->_M_node;
  local_d0._M_node = local_a0._M_node[1]._M_next;
  local_d8._M_node = iStack_100._M_current[-1]._M_node;
  local_110._M_node = local_d8._M_node[1]._M_next;
  local_70 = local_d0._M_node[1]._M_prev;
  _Var8._M_node = local_90._M_node;
  do {
    _Var16._M_node = _Var8._M_node;
    _Var8._M_node = _Var16._M_node[1]._M_prev;
  } while (_Var16._M_node[1]._M_prev != local_90._M_node);
  p_Var9 = local_70;
  for (p_Var14 = local_70[1]._M_prev; p_Var14 != local_d0._M_node; p_Var14 = p_Var14[1]._M_prev) {
    p_Var9 = p_Var14;
  }
  local_e8 = local_150._M_node[1]._M_prev;
  local_80 = local_d8._M_node[1]._M_prev;
  p_Var14 = local_80;
  do {
    p_Var12 = p_Var14;
    p_Var14 = p_Var12[1]._M_prev;
  } while (p_Var14 != local_d8._M_node);
  p_Var14 = p_Var2[2]._M_next;
  p_Var10 = local_c0[2]._M_next;
  p_Var3 = local_c0[1]._M_prev;
  p_Var2[1]._M_next =
       (_List_node_base *)(((double)local_c0[1]._M_next + (double)p_Var2[1]._M_next) * 0.5);
  p_Var2[1]._M_prev = (_List_node_base *)(((double)p_Var3 + (double)p_Var2[1]._M_prev) * 0.5);
  p_Var2[2]._M_next = (_List_node_base *)(((double)p_Var14 + (double)p_Var10) * 0.5);
  local_78 = local_d0._M_node[2]._M_next;
  local_88 = local_110._M_node[2]._M_next;
  local_128 = (_List_iterator<CMU462::Edge> *)0x0;
  iStack_120._M_current = (_List_iterator<CMU462::Edge> *)0x0;
  local_118 = (_List_iterator<CMU462::Edge> *)0x0;
  std::vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>::
  _M_realloc_insert<std::_List_iterator<CMU462::Edge>const&>
            ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
              *)&local_128,(iterator)0x0,&local_68);
  p_Var14 = local_d0._M_node[3]._M_next;
  local_b0._M_node = local_d8._M_node[2]._M_prev;
  local_c8 = local_d8._M_node[3]._M_next;
  local_e0._M_node = local_150._M_node[3]._M_next;
  local_b8._M_node = local_90._M_node[3]._M_next;
  local_a8._M_node = local_a0._M_node[2]._M_prev;
  local_148 = (_List_iterator<CMU462::Face> *)0x0;
  iStack_140._M_current = (_List_iterator<CMU462::Face> *)0x0;
  local_138 = (_List_iterator<CMU462::Face> *)0x0;
  if (local_a0._M_node[1]._M_prev == _Var16._M_node) {
    if (iStack_160._M_current == local_158) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_168,iStack_160,&local_a0);
    }
    else {
      (iStack_160._M_current)->_M_node = local_a0._M_node;
      iStack_160._M_current = iStack_160._M_current + 1;
    }
    if (iStack_160._M_current == local_158) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_168,iStack_160,&local_d0);
    }
    else {
      (iStack_160._M_current)->_M_node = local_d0._M_node;
      iStack_160._M_current = iStack_160._M_current + 1;
    }
    if (iStack_120._M_current == local_118) {
      std::
      vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>::
      _M_realloc_insert<std::_List_iterator<CMU462::Edge>const&>
                ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                  *)&local_128,iStack_120,&local_a8);
    }
    else {
      (iStack_120._M_current)->_M_node = local_a8._M_node;
      iStack_120._M_current = iStack_120._M_current + 1;
    }
    if (iStack_140._M_current == local_138) {
      std::
      vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>::
      _M_realloc_insert<std::_List_iterator<CMU462::Face>const&>
                ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                  *)&local_148,iStack_140,&local_b8);
    }
    else {
      (iStack_140._M_current)->_M_node = local_b8._M_node;
      iStack_140._M_current = iStack_140._M_current + 1;
    }
    p_Var10 = local_70;
    if (p_Var14 == local_c8 && local_e8[1]._M_prev == local_110._M_node) {
      p_Var10 = local_e8;
    }
    _Var16._M_node[1]._M_prev = p_Var10;
    _Var16._M_node[3]._M_next = p_Var14;
    p_Var9[1]._M_prev = _Var16._M_node;
    local_78[0xc]._M_prev = _Var16._M_node;
  }
  else {
    _Var16._M_node[1]._M_prev = local_a0._M_node;
    p_Var14 = local_b8._M_node;
    _Var16._M_node = local_a0._M_node;
  }
  p_Var14[9]._M_next = _Var16._M_node;
  for (p_Var11 = local_108; p_Var11 != iStack_100._M_current; p_Var11 = p_Var11 + 1) {
    p_Var11->_M_node[2]._M_next = p_Var2;
  }
  if (local_e8[1]._M_prev == local_110._M_node) {
    if (iStack_160._M_current == local_158) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_168,iStack_160,&local_d8);
    }
    else {
      (iStack_160._M_current)->_M_node = local_d8._M_node;
      iStack_160._M_current = iStack_160._M_current + 1;
    }
    if (iStack_160._M_current == local_158) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_168,iStack_160,&local_110);
    }
    else {
      (iStack_160._M_current)->_M_node = local_110._M_node;
      iStack_160._M_current = iStack_160._M_current + 1;
    }
    if (iStack_120._M_current == local_118) {
      std::
      vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>::
      _M_realloc_insert<std::_List_iterator<CMU462::Edge>const&>
                ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                  *)&local_128,iStack_120,&local_b0);
    }
    else {
      (iStack_120._M_current)->_M_node = local_b0._M_node;
      iStack_120._M_current = iStack_120._M_current + 1;
    }
    if (iStack_140._M_current == local_138) {
      std::
      vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>::
      _M_realloc_insert<std::_List_iterator<CMU462::Face>const&>
                ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                  *)&local_148,iStack_140,&local_e0);
    }
    else {
      (iStack_140._M_current)->_M_node = local_e0._M_node;
      iStack_140._M_current = iStack_140._M_current + 1;
    }
    local_e8[1]._M_prev = local_80;
    local_e8[3]._M_next = local_c8;
    p_Var12[1]._M_prev = local_e8;
    local_88[0xc]._M_prev = local_80;
    _Var13._M_node = local_c8;
  }
  else {
    local_110._M_node[1]._M_prev = local_e8;
    _Var13._M_node = local_e0._M_node;
  }
  iVar5._M_current = (_List_iterator<CMU462::Halfedge> *)iStack_160;
  _Var13._M_node[9]._M_next = local_e8;
  p_Var2[0xc]._M_prev = local_e8;
  for (p_Var11 = local_168; p_Var9 = local_c0, p_Var11 != iVar5._M_current; p_Var11 = p_Var11 + 1) {
    p_Var9 = p_Var11->_M_node;
    psVar1 = &(this->halfedges).
              super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var9,0x38);
  }
  psVar1 = &(this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var9,0xd0);
  iVar7._M_current = (_List_iterator<CMU462::Edge> *)iStack_120;
  for (p_Var15 = local_128; iVar6._M_current = (_List_iterator<CMU462::Face> *)iStack_140,
      p_Var4 = local_148, p_Var15 != iVar7._M_current; p_Var15 = p_Var15 + 1) {
    p_Var9 = p_Var15->_M_node;
    psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var9,0x60);
  }
  for (; p_Var4 != iVar6._M_current; p_Var4 = p_Var4 + 1) {
    p_Var9 = p_Var4->_M_node;
    psVar1 = &(this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var9,0xa0);
  }
  if (local_148 != (_List_iterator<CMU462::Face> *)0x0) {
    operator_delete(local_148,(long)local_138 - (long)local_148);
  }
  if (local_128 != (_List_iterator<CMU462::Edge> *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  if (local_108 != (_List_iterator<CMU462::Halfedge> *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  if (local_168 != (_List_iterator<CMU462::Halfedge> *)0x0) {
    operator_delete(local_168,(long)local_158 - (long)local_168);
  }
  return (VertexIter)p_Var2;
}

Assistant:

VertexIter HalfedgeMesh::collapseEdge(EdgeIter e) {
  // This method should collapse the given edge and return an iterator to
  // the new vertex created by the collapse.

  remove_tetrahedron(e);

  auto h = e->halfedge(), h_twin = h->twin();
  auto v_keep = h->vertex(), v_delete = h_twin->vertex();

  // Collect
  // HalfEdges
  vector<HalfedgeIter> h_to_be_deleted;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(h_twin);

  vector<HalfedgeIter> h_delete_vec;
  auto hi = h_twin;
  while (hi->twin()->next() != h_twin) {
    hi = hi->twin()->next();
    h_delete_vec.push_back(hi);
  }
  auto h_0 = h_delete_vec.front(), h_0_twin = h_0->twin(),
       h_n = h_delete_vec.back(), h_n_twin = h_n->twin(),
       h_1 = h_0_twin->next();

  auto h_first = h;
  while (h_first->next() != h) {
    h_first = h_first->next();
  }
  auto h_last = h_twin->next();
  auto h_first_prev = h_1;
  while (h_first_prev->next() != h_0_twin) {
    h_first_prev = h_first_prev->next();
  }
  auto h_last_prev = h_n->next();
  while (h_last_prev->next() != h_n) {
    h_last_prev = h_last_prev->next();
  }
  auto h_last_next = h_n->next();

  // Vertices
  v_keep->position = (v_keep->position + v_delete->position) / 2;
  auto v_0 = h_0_twin->vertex(), v_n = h_n_twin->vertex();

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(e);
  auto e_0 = h_0->edge(), e_n = h_n->edge();

  // Faces
  vector<FaceIter> f_to_be_deleted;
  auto f_0 = h->face(),
       f_1 = h_0_twin->face(),
       f_n = h_n->face(),
       f_n_p1 = h_twin->face();

  // Reassign
  if (h_0->next() == h_first) {
    h_to_be_deleted.push_back(h_0);
    h_to_be_deleted.push_back(h_0_twin);
    e_to_be_deleted.push_back(e_0);
    f_to_be_deleted.push_back(f_0);

    // HalfEdges
    // We have a corner case here: when the faces on either side of the edge have a degree of 3,
    // while the vertex to be deleted also has a degree of 3. We have to deal with this carefully.
    if (h_last->next() == h_n_twin && f_1 == f_n) {
      h_first->next() = h_last;
    } else {
      h_first->next() = h_1;
    }
    h_first->face() = f_1;
    h_first_prev->next() = h_first;

    // Vertices
    v_0->halfedge() = h_first;

    // Faces
    f_1->halfedge() = h_first;
  } else {
    h_first->next() = h_0;
    f_0->halfedge() = h_0;
  }
  for (auto& hj : h_delete_vec) {
    hj->vertex() = v_keep;
  }
  if (h_last->next() == h_n_twin) {
    h_to_be_deleted.push_back(h_n);
    h_to_be_deleted.push_back(h_n_twin);
    e_to_be_deleted.push_back(e_n);
    f_to_be_deleted.push_back(f_n_p1);

    // HalfEdges
    h_last->next() = h_last_next;
    h_last->face() = f_n;
    h_last_prev->next() = h_last;

    // Vertices
    v_n->halfedge() = h_last_next;

    // Faces
    f_n->halfedge() = h_last;
  } else {
    h_n_twin->next() = h_last;
    f_n_p1->halfedge() = h_last;
  }
  v_keep->halfedge() = h_last;

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v_delete);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return v_keep;
}